

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::generateArray
                 (int seed,GLValue min,GLValue max,int count,int componentCount,int stride,
                 InputType type)

{
  GLValue max_00;
  undefined8 uVar1;
  int iVar2;
  GLValue min_00;
  int local_50;
  int local_4c;
  int componentNdx;
  int vertexNdx;
  deRandom rnd;
  char *data;
  int count_local;
  int seed_local;
  GLValue max_local;
  GLValue min_local;
  
  rnd.z = 0;
  rnd.w = 0;
  deRandom_init((deRandom *)&componentNdx,seed);
  if (stride == 0) {
    iVar2 = gls::Array::inputTypeSize(type);
    stride = componentCount * iVar2;
  }
  rnd._8_8_ = operator_new__((long)(stride * count));
  for (local_4c = 0; local_4c < count; local_4c = local_4c + 1) {
    for (local_50 = 0; uVar1 = rnd._8_8_, local_50 < componentCount; local_50 = local_50 + 1) {
      iVar2 = gls::Array::inputTypeSize(type);
      max_00._4_4_ = seed_local;
      max_00.type = max.type;
      min_00._4_4_ = 0;
      min_00.type = min.type;
      max_00.field_1 = max.field_1;
      min_00.field_1 = min.field_1;
      setData((char *)(uVar1 + (long)(local_4c * stride + iVar2 * local_50)),type,
              (deRandom *)&componentNdx,min_00,max_00);
    }
  }
  return (char *)rnd._8_8_;
}

Assistant:

char* RandomArrayGenerator::generateArray (int seed, GLValue min, GLValue max, int count, int componentCount, int stride, Array::InputType type)
{
	char* data = NULL;

	deRandom rnd;
	deRandom_init(&rnd, seed);

	if (stride == 0)
		stride = componentCount * Array::inputTypeSize(type);

	data = new char[stride * count];

	for (int vertexNdx = 0; vertexNdx < count; vertexNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			setData(&(data[vertexNdx * stride + Array::inputTypeSize(type) * componentNdx]), type, rnd, min, max);
		}
	}

	return data;
}